

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_video.cpp
# Opt level: O3

void __thiscall DCanvas::~DCanvas(DCanvas *this)

{
  uint uVar1;
  PClass *pPVar2;
  DObject **ppDVar3;
  DCanvas *pDVar4;
  DCanvas *pDVar5;
  DCanvas **ppDVar6;
  PClass *this_00;
  
  (this->super_DObject)._vptr_DObject = (_func_int **)&PTR_StaticType_00873540;
  if (CanvasChain != (DCanvas *)0x0) {
    pDVar5 = CanvasChain;
    if (CanvasChain == this) {
      ppDVar6 = &CanvasChain;
    }
    else {
      do {
        pDVar4 = pDVar5;
        pDVar5 = pDVar4->Next;
        if (pDVar5 == (DCanvas *)0x0) goto code_r0x004c7dae;
      } while (pDVar5 != this);
      ppDVar6 = &pDVar4->Next;
    }
    *ppDVar6 = pDVar5->Next;
    DObject::~DObject(&this->super_DObject);
    return;
  }
code_r0x004c7dae:
  (this->super_DObject)._vptr_DObject = (_func_int **)&PTR_StaticType_0086d220;
  pPVar2 = DObject::RegistrationInfo.MyClass;
  if (PClass::bShutdown == false) {
    this_00 = (this->super_DObject).Class;
    if (this_00 == (PClass *)0x0) {
      (this->super_DObject).Class = DObject::RegistrationInfo.MyClass;
      this_00 = pPVar2;
    }
    uVar1 = (this->super_DObject).ObjectFlags;
    if ((uVar1 & 0x40) == 0) {
      if (-1 < (char)uVar1) {
        Printf("Warning: \'%s\' is freed outside the GC process.\n");
      }
      DObject::StaticPointerSubstitution(&this->super_DObject,(DObject *)0x0);
      ppDVar3 = (DObject **)&GC::Root;
      if (GC::Root != (DCanvas *)0x0) {
        pDVar5 = GC::Root;
        if (GC::Root != this) {
          do {
            pDVar4 = pDVar5;
            pDVar5 = (DCanvas *)(pDVar4->super_DObject).ObjNext;
            if (pDVar5 == (DCanvas *)0x0) goto LAB_004c7e75;
          } while (pDVar5 != this);
          ppDVar3 = &(pDVar4->super_DObject).ObjNext;
        }
        *ppDVar3 = (this->super_DObject).ObjNext;
        if (&(this->super_DObject).ObjNext == GC::SweepPos) {
          GC::SweepPos = ppDVar3;
        }
      }
LAB_004c7e75:
      ppDVar3 = (DObject **)&GC::Gray;
      if (GC::Gray != (DCanvas *)0x0 && ((this->super_DObject).ObjectFlags & 7) == 0) {
        pDVar5 = GC::Gray;
        if (GC::Gray != this) {
          do {
            pDVar4 = pDVar5;
            pDVar5 = (DCanvas *)(pDVar4->super_DObject).GCNext;
            if (pDVar5 == (DCanvas *)0x0) goto LAB_004c7eb3;
          } while (pDVar5 != this);
          ppDVar3 = &(pDVar4->super_DObject).GCNext;
        }
        *ppDVar3 = (this->super_DObject).GCNext;
      }
    }
LAB_004c7eb3:
    PClass::DestroySpecials(this_00,this);
  }
  return;
}

Assistant:

DCanvas::~DCanvas ()
{
	// Remove from list of active canvases
	DCanvas *probe = CanvasChain, **prev;

	prev = &CanvasChain;
	probe = CanvasChain;

	while (probe != NULL)
	{
		if (probe == this)
		{
			*prev = probe->Next;
			break;
		}
		prev = &probe->Next;
		probe = probe->Next;
	}
}